

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGlobalVC.cxx
# Opt level: O0

void __thiscall cmCTestGlobalVC::~cmCTestGlobalVC(cmCTestGlobalVC *this)

{
  cmCTestGlobalVC *this_local;
  
  (this->super_cmCTestVC)._vptr_cmCTestVC = (_func_int **)&PTR__cmCTestGlobalVC_00c404c8;
  std::__cxx11::list<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::~list
            (&this->Revisions);
  cmCTestVC::Revision::~Revision(&this->PriorRev);
  std::__cxx11::string::~string((string *)&this->NewRevision);
  std::__cxx11::string::~string((string *)&this->OldRevision);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>_>
  ::~map(&this->Dirs);
  cmCTestVC::~cmCTestVC(&this->super_cmCTestVC);
  return;
}

Assistant:

cmCTestGlobalVC::~cmCTestGlobalVC()
{
}